

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::Server(Server *this,string *server_addr,uint16_t port_no,uint64_t time_out)

{
  _Rb_tree_header *p_Var1;
  
  (this->timer_hook).super__Vector_base<void_(*)(Server_*),_std::allocator<void_(*)(Server_*)>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timer_hook).super__Vector_base<void_(*)(Server_*),_std::allocator<void_(*)(Server_*)>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->http_request_hook).
  super__Vector_base<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->timer_hook).super__Vector_base<void_(*)(Server_*),_std::allocator<void_(*)(Server_*)>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->http_request_hook).
  super__Vector_base<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->http_request_hook).
  super__Vector_base<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->server_addr)._M_dataplus._M_p = (pointer)&(this->server_addr).field_2;
  (this->server_addr)._M_string_length = 0;
  (this->server_addr).field_2._M_local_buf[0] = '\0';
  (this->fd_to_client)._M_h._M_buckets = &(this->fd_to_client)._M_h._M_single_bucket;
  (this->fd_to_client)._M_h._M_bucket_count = 1;
  (this->fd_to_client)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fd_to_client)._M_h._M_element_count = 0;
  (this->fd_to_client)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fd_to_client)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fd_to_client)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->loaded_modules)._M_t._M_impl.super__Rb_tree_header;
  (this->loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)&this->server_addr);
  this->port_no = port_no;
  this->time_out = time_out;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::clear(&(this->loaded_modules)._M_t);
  this->time_stamp = 0;
  this->udp_fd = -1;
  return;
}

Assistant:

Server::Server(std::string server_addr, uint16_t port_no, uint64_t time_out /* = 60 */ ) {
    this->server_addr = server_addr;
    this->port_no = port_no;
    this->time_out = time_out;
    this->loaded_modules.clear();
    this->time_stamp = 0;
    this->udp_fd = -1;
}